

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESSource(RTCPCompoundPacketBuilder *this,uint32_t ssrc)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  
  uVar3 = 0xffffffd6;
  if (this->arebuilding == true) {
    sVar1 = this->appsize;
    sVar2 = this->byesize;
    sVar4 = Report::NeededBytes(&this->report);
    sVar5 = SDES::NeededBytesWithExtraSource(&this->sdes);
    uVar3 = 0xffffffd5;
    if (sVar5 + sVar4 + sVar1 + sVar2 <= this->maximumpacketsize) {
      uVar3 = SDES::AddSSRC(&this->sdes,ssrc);
      uVar3 = uVar3 & (int)uVar3 >> 0x1f;
    }
  }
  return uVar3;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESSource(uint32_t ssrc)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextrasource = sdes.NeededBytesWithExtraSource();

	if ((totalotherbytes + sdessizewithextrasource) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	int status;

	if ((status = sdes.AddSSRC(ssrc)) < 0)
		return status;
	return 0;
}